

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isobusfs_cli.c
# Opt level: O0

void isobusfs_cli_prepare_response_event(isobusfs_event *event,int sock,uint8_t fs_function)

{
  undefined1 in_DL;
  undefined4 in_ESI;
  long in_RDI;
  timespec tVar1;
  timespec timeout_timespec;
  timespec current_time;
  long local_40;
  long local_38;
  timespec local_20;
  long local_8;
  
  *(undefined4 *)(in_RDI + 0x1c) = in_ESI;
  *(undefined1 *)(in_RDI + 0x18) = in_DL;
  local_8 = in_RDI;
  clock_gettime(0,&local_20);
  tVar1 = ms_to_timespec(1000);
  local_40 = tVar1.tv_sec;
  local_38 = tVar1.tv_nsec;
  *(__time_t *)(local_8 + 8) = local_20.tv_sec + local_40;
  *(long *)(local_8 + 0x10) = local_20.tv_nsec + local_38;
  if (999999999 < *(long *)(local_8 + 0x10)) {
    *(long *)(local_8 + 0x10) = *(long *)(local_8 + 0x10) + -1000000000;
    *(long *)(local_8 + 8) = *(long *)(local_8 + 8) + 1;
  }
  *(undefined1 *)(local_8 + 0x20) = 1;
  return;
}

Assistant:

void isobusfs_cli_prepare_response_event(struct isobusfs_event *event, int sock,
					 uint8_t fs_function)
{
	struct timespec current_time, timeout_timespec;

	event->fd = sock;
	event->fs_function = fs_function;

	/* Calculate the timeout */
	clock_gettime(CLOCK_REALTIME, &current_time);
	timeout_timespec = ms_to_timespec(ISOBUSFS_CLI_DEFAULT_WAIT_TIMEOUT_MS);
	event->timeout.tv_sec = current_time.tv_sec + timeout_timespec.tv_sec;
	event->timeout.tv_nsec = current_time.tv_nsec + timeout_timespec.tv_nsec;

	/* Adjust for nanosecond overflow */
	if (event->timeout.tv_nsec >= 1000000000) {
		event->timeout.tv_nsec -= 1000000000;
		event->timeout.tv_sec++;
	}

	event->one_shot = true;
}